

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arena.h
# Opt level: O0

void __thiscall memt::Arena::Guard::~Guard(Guard *this)

{
  Guard *this_local;
  
  if (this->mArena != (Arena *)0x0) {
    restoreToGuardPoint(this->mArena,this->mPosition);
  }
  return;
}

Assistant:

~Guard() {
		if (mArena != 0)
		  mArena->restoreToGuardPoint(mPosition);
	  }